

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityWriter::pumpFrom
          (HttpFixedLengthEntityWriter *this,AsyncInputStream *input,uint64_t amount)

{
  Coroutine<unsigned_long> *this_00;
  AsyncInputStream *pAVar1;
  long *plVar2;
  HttpOutputStream *this_01;
  PromiseAwaiter<unsigned_long> *pPVar3;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_02;
  SourceLocation location;
  bool bVar4;
  coroutine_handle<void> handle;
  _func_int **pp_Var5;
  HttpOutputStream *input_00;
  unsigned_long uVar6;
  _func_int **in_RCX;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  Fault f;
  NullableValue<unsigned_long> _available2505;
  
  handle._M_fr_ptr = operator_new(0x610);
  *(code **)handle._M_fr_ptr = pumpFrom;
  *(code **)((long)handle._M_fr_ptr + 8) = pumpFrom;
  this_00 = (Coroutine<unsigned_long> *)((long)handle._M_fr_ptr + 0x10);
  *(_func_int ***)((long)handle._M_fr_ptr + 0x5e8) = in_RCX;
  *(uint64_t *)((long)handle._M_fr_ptr + 0x5e0) = amount;
  *(AsyncInputStream **)((long)handle._M_fr_ptr + 0x5d8) = input;
  _kjCondition.left = (unsigned_long *)anon_var_dwarf_67f91a;
  _kjCondition.right = (unsigned_long *)0x3f4673;
  _kjCondition.op.content.ptr = (char *)0x15000009c1;
  location.function = "pumpFrom";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x9c1;
  location.columnNumber = 0x15;
  kj::_::Coroutine<unsigned_long>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<unsigned_long>::get_return_object((Coroutine<unsigned_long> *)this);
  if (in_RCX == (_func_int **)0x0) {
    kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
              ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,0);
  }
  else {
    pAVar1 = input + 3;
    pp_Var5 = input[3]._vptr_AsyncInputStream;
    *(_func_int ***)((long)handle._M_fr_ptr + 0x5f0) = pp_Var5;
    if (pp_Var5 < in_RCX) {
      (**(code **)(*(long *)amount + 0x10))(&_kjCondition,amount);
      _available2505.isSet = (bool)(char)_kjCondition.left;
      if ((char)_kjCondition.left == '\x01') {
        _kjCondition.left = (unsigned_long *)&_available2505.field_1;
        _available2505.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)_kjCondition.right;
        pp_Var5 = pAVar1->_vptr_AsyncInputStream;
        _kjCondition.op.content.ptr = " <= ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = _kjCondition.right <= pp_Var5;
        bVar4 = pp_Var5 < _kjCondition.right;
        _kjCondition.right = (unsigned_long *)pAVar1;
        if (bVar4) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[25]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x9cc,FAILED,"available <= length","_kjCondition,\"overwrote Content-Length\""
                     ,&_kjCondition,(char (*) [25])"overwrote Content-Length");
          kj::_::Debug::Fault::fatal(&f);
        }
      }
      else {
        pp_Var5 = pAVar1->_vptr_AsyncInputStream;
      }
    }
    if (pp_Var5 <= in_RCX) {
      in_RCX = pp_Var5;
    }
    *(_func_int ***)((long)handle._M_fr_ptr + 0x5f8) = in_RCX;
    pAVar1->_vptr_AsyncInputStream = (_func_int **)((long)pp_Var5 - (long)in_RCX);
    if (pp_Var5 == (_func_int **)0x0) {
      uVar6 = 0;
    }
    else {
      input_00 = HttpEntityBodyWriter::getInner((HttpEntityBodyWriter *)input);
      this_01 = (HttpOutputStream *)((long)handle._M_fr_ptr + 0x5c0);
      HttpOutputStream::pumpBodyFrom(this_01,(AsyncInputStream *)input_00,amount);
      pPVar3 = (PromiseAwaiter<unsigned_long> *)((long)handle._M_fr_ptr + 0x240);
      co_await<unsigned_long>(pPVar3,(Promise<unsigned_long> *)this_01);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x608) = 0;
      bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)pPVar3,(CoroutineBase *)this_00);
      if (bVar4) {
        return (PromiseBase)(PromiseBase)this;
      }
      uVar6 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(pPVar3);
      kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(pPVar3);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
      plVar2 = (long *)(*(long *)((long)handle._M_fr_ptr + 0x5d8) + 0x18);
      *plVar2 = *plVar2 + (*(long *)((long)handle._M_fr_ptr + 0x5f8) - uVar6);
      if (*plVar2 == 0) {
        HttpEntityBodyWriter::doneWriting
                  (*(HttpEntityBodyWriter **)((long)handle._M_fr_ptr + 0x5d8));
      }
    }
    *(unsigned_long *)((long)handle._M_fr_ptr + 0x600) = uVar6;
    if ((uVar6 == *(unsigned_long *)((long)handle._M_fr_ptr + 0x5f8)) &&
       (*(ulong *)((long)handle._M_fr_ptr + 0x5f0) < *(ulong *)((long)handle._M_fr_ptr + 0x5e8))) {
      this_02 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5d0);
      (**(code **)(**(long **)((long)handle._M_fr_ptr + 0x5e0) + 8))
                (this_02,*(long **)((long)handle._M_fr_ptr + 0x5e0),&pumpFrom::junk,1,1);
      pPVar3 = (PromiseAwaiter<unsigned_long> *)((long)handle._M_fr_ptr + 0x400);
      co_await<unsigned_long>(pPVar3,(Promise<unsigned_long> *)this_02);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x608) = 1;
      bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)pPVar3,(CoroutineBase *)this_00);
      if (bVar4) {
        return (PromiseBase)(PromiseBase)this;
      }
      uVar6 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(pPVar3);
      kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(pPVar3);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_02);
      _kjCondition.left = (unsigned_long *)((long)handle._M_fr_ptr + 0x5c8);
      *_kjCondition.left = uVar6;
      _kjCondition.right = (unsigned_long *)((ulong)_kjCondition.right & 0xffffffff00000000);
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = uVar6 == 0;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[25]>
                  ((Fault *)&_available2505,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x9e2,FAILED,"extra == 0","_kjCondition,\"overwrote Content-Length\"",
                   (DebugComparison<unsigned_long_&,_int> *)&_kjCondition,
                   (char (*) [25])"overwrote Content-Length");
        kj::_::Debug::Fault::fatal((Fault *)&_available2505);
      }
      uVar6 = *(unsigned_long *)((long)handle._M_fr_ptr + 0x600);
    }
    kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
              ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,uVar6);
  }
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x608) = 2;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpFrom(AsyncInputStream& input, uint64_t amount) {
    if (amount == 0) co_return 0;

    bool overshot = amount > length;
    if (overshot) {
      // Hmm, the requested amount was too large, but it's common to specify kj::max as the amount
      // to pump, in which case we pump to EOF. Let's try to verify whether EOF is where we
      // expect it to be.
      KJ_IF_SOME(available, input.tryGetLength()) {
        // Great, the stream knows how large it is. If it's indeed larger than the space available
        // then let's abort.
        KJ_REQUIRE(available <= length, "overwrote Content-Length");
      } else {
        // OK, we have no idea how large the input is, so we'll have to check later.
      }
    }

    amount = kj::min(amount, length);
    length -= amount;
    uint64_t actual = amount;

    if (amount != 0) {
      actual = co_await getInner().pumpBodyFrom(input, amount);
      length += amount - actual;
      if (length == 0) doneWriting();
    }

    if (overshot) {
        if (actual == amount) {
          // We read exactly the amount expected. In order to detect an overshoot, we have to
          // try reading one more byte. Ugh.
          static byte junk;
          auto extra = co_await input.tryRead(&junk, 1, 1);
          KJ_REQUIRE(extra == 0, "overwrote Content-Length");
        } else {
          // We actually read less data than requested so we couldn't have overshot. In fact, we
          // undershot.
        }
    }

    co_return actual;
  }